

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void blogc_print_usage(void)

{
  puts(
      "usage: blogc [-h] [-v] [-d] [-i] [-l [-e SOURCE]] [-D KEY=VALUE ...] [-p KEY]\n             [-t TEMPLATE] [-o OUTPUT] [SOURCE ...]"
      );
  return;
}

Assistant:

static void
blogc_print_usage(void)
{
    printf(
        "usage: blogc "
#ifdef MAKE_EMBEDDED
        "[-m] "
#endif
        "[-h] [-v] [-d] [-i] [-l [-e SOURCE]] [-D KEY=VALUE ...] [-p KEY]\n"
        "             [-t TEMPLATE] [-o OUTPUT] [SOURCE ...]\n");
}